

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_fetching.c
# Opt level: O1

void CGTFS_DatabaseFetching(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FILE *pFVar5;
  long lVar6;
  agency_t *expected;
  feed_db_t db;
  stop_t *local_68;
  stop_t *local_60;
  feed_db_t local_58;
  
  iVar3 = greatest_test_pre("db_all_agencies_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/agency.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x12;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/agency.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_agencies((FILE *)pFVar5,(agency_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 4) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_agencies_db(&local_58,(agency_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 4) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_agency((agency_t *)(local_60->id + lVar6),
                                   (agency_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x24;
                greatest_info.msg = "equal_agency(&(expected[i]), &(records[i]))";
                goto LAB_001165c3;
              }
              lVar6 = lVar6 + 0x280;
            } while (lVar6 != 0xa00);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_001165dc;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x22;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x17;
          greatest_info.msg = "4 != expected_count";
        }
LAB_001165c3:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_001165dc:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_calendar_dates_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/calendar_dates.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x33;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/calendar_dates.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_calendar_dates((FILE *)pFVar5,(calendar_date_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 9) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_calendar_dates_db(&local_58,(calendar_date_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 9) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_calendar_date((calendar_date_t *)(local_60->id + lVar6),
                                          (calendar_date_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x45;
                greatest_info.msg = "equal_calendar_date(&(expected[i]), &(records[i]))";
                goto LAB_00116888;
              }
              lVar6 = lVar6 + 0x50;
            } while (lVar6 != 0x2d0);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_001168a1;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",9);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x43;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",9);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x38;
          greatest_info.msg = "9 != expected_count";
        }
LAB_00116888:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_001168a1:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_calendar_records_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/calendar.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x54;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/calendar.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_calendar_records((FILE *)pFVar5,(calendar_record_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 4) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_calendar_records_db(&local_58,(calendar_record_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 4) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_calendar_record
                                ((calendar_record_t *)(local_60->id + lVar6),
                                 (calendar_record_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x66;
                greatest_info.msg = "equal_calendar_record(&(expected[i]), &(records[i]))";
                goto LAB_00116b4d;
              }
              lVar6 = lVar6 + 0x70;
            } while (lVar6 != 0x1c0);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_00116b66;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 100;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x59;
          greatest_info.msg = "4 != expected_count";
        }
LAB_00116b4d:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_00116b66:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_fare_attributes_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/fare_attributes.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x75;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/fare_attributes.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_fare_attributes((FILE *)pFVar5,(fare_attributes_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 2) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_fare_attributes_db(&local_58,(fare_attributes_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 2) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_fare_attributes
                                ((fare_attributes_t *)(local_60->id + lVar6),
                                 (fare_attributes_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x87;
                greatest_info.msg = "equal_fare_attributes(&(expected[i]), &(records[i]))";
                goto LAB_00116e14;
              }
              lVar6 = lVar6 + 0xa0;
            } while (lVar6 == 0xa0);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_00116e2d;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",2);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x85;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",2);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x7a;
          greatest_info.msg = "2 != expected_count";
        }
LAB_00116e14:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_00116e2d:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_fare_rules_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/fare_rules.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x96;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/fare_rules.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_fare_rules((FILE *)pFVar5,(fare_rule_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 4) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_fare_rules_db(&local_58,(fare_rule_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 4) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_fare_rule((fare_rule_t *)(local_60->id + lVar6),
                                      (fare_rule_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0xa8;
                greatest_info.msg = "equal_fare_rule(&(expected[i]), &(records[i]))";
                goto LAB_001170db;
              }
              lVar6 = lVar6 + 0x140;
            } while (lVar6 != 0x500);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_001170f4;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xa6;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x9b;
          greatest_info.msg = "4 != expected_count";
        }
LAB_001170db:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_001170f4:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_feed_info_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/feed_info.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0xb7;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/feed_info.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_feed_info((FILE *)pFVar5,(feed_info_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 1) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_feed_info_db(&local_58,(feed_info_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 != 1) {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",1);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar4);
            fputc(10,_stdout);
            greatest_info.fail_line = 199;
            greatest_info.msg = "expected_count != retrieved_count";
            goto LAB_001173a6;
          }
          bVar2 = true;
          do {
            bVar1 = bVar2;
            if (!bVar1) goto LAB_001171f9;
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar3 = equal_feed_info((feed_info_t *)local_60,(feed_info_t *)local_68);
            bVar2 = false;
          } while (iVar3 != 0);
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
          ;
          greatest_info.fail_line = 0xc9;
          greatest_info.msg = "equal_feed_info(&(expected[i]), &(records[i]))";
          if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
          if (!bVar1) {
LAB_001171f9:
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_001173bf;
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",1);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xbc;
          greatest_info.msg = "1 != expected_count";
LAB_001173a6:
          if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        iVar3 = -1;
      }
    }
LAB_001173bf:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_frequencies_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/frequencies.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0xd8;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/frequencies.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_frequencies((FILE *)pFVar5,(frequency_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 0xb) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_frequencies_db(&local_58,(frequency_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 0xb) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_frequency((frequency_t *)(local_60->id + lVar6),
                                      (frequency_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0xea;
                greatest_info.msg = "equal_frequency(&(expected[i]), &(records[i]))";
                goto LAB_0011766b;
              }
              lVar6 = lVar6 + 0x5c;
            } while (lVar6 != 0x3f4);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_00117684;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xb);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xe8;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xb);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xdd;
          greatest_info.msg = "11 != expected_count";
        }
LAB_0011766b:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_00117684:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_levels_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/levels.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0xf9;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/levels.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_levels((FILE *)pFVar5,(level_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 4) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_levels_db(&local_58,(level_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 4) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_level((level_t *)(local_60->id + lVar6),
                                  (level_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x10b;
                greatest_info.msg = "equal_level(&(expected[i]), &(records[i]))";
                goto LAB_00117932;
              }
              lVar6 = lVar6 + 0x88;
            } while (lVar6 != 0x220);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_0011794b;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x109;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xfe;
          greatest_info.msg = "4 != expected_count";
        }
LAB_00117932:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_0011794b:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_pathways_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/pathways.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x11a;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/pathways.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_pathways((FILE *)pFVar5,(pathway_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 2) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_pathways_db(&local_58,(pathway_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 2) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_pathway((pathway_t *)(local_60->id + lVar6),
                                    (pathway_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 300;
                greatest_info.msg = "equal_pathway(&(expected[i]), &(records[i]))";
                goto LAB_00117bf9;
              }
              lVar6 = lVar6 + 0x1e8;
            } while (lVar6 == 0x1e8);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_00117c12;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",2);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x12a;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",2);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x11f;
          greatest_info.msg = "2 != expected_count";
        }
LAB_00117bf9:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_00117c12:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_routes_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/routes.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x13b;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/routes.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_routes((FILE *)pFVar5,(route_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 8) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_routes_db(&local_58,(route_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 8) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_route((route_t *)(local_60->id + lVar6),
                                  (route_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x14d;
                greatest_info.msg = "equal_route(&(expected[i]), &(records[i]))";
                goto LAB_00117ec0;
              }
              lVar6 = lVar6 + 0x2d8;
            } while (lVar6 != 0x16c0);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_00117ed9;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",8);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x14b;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",8);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x140;
          greatest_info.msg = "8 != expected_count";
        }
LAB_00117ec0:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_00117ed9:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_shapes_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/shapes.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x15c;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/shapes.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_shapes((FILE *)pFVar5,(shape_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 10) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_shapes_db(&local_58,(shape_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 10) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_shape((shape_t *)(local_60->id + lVar6),
                                  (shape_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x16e;
                greatest_info.msg = "equal_shape(&(expected[i]), &(records[i]))";
                goto LAB_00118185;
              }
              lVar6 = lVar6 + 0x70;
            } while (lVar6 != 0x460);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_0011819e;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",10);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x16c;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",10);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x161;
          greatest_info.msg = "10 != expected_count";
        }
LAB_00118185:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_0011819e:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_stop_times_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/stop_times.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x17d;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/stop_times.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_stop_times((FILE *)pFVar5,(stop_time_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 0x1c) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_stop_times_db(&local_58,(stop_time_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 0x1c) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_stop_time((stop_time_t *)(local_60->id + lVar6),
                                      (stop_time_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 399;
                greatest_info.msg = "equal_stop_time(&(expected[i]), &(records[i]))";
                goto LAB_0011844c;
              }
              lVar6 = lVar6 + 0xf0;
            } while (lVar6 != 0x1a40);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_00118465;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0x1c);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x18d;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0x1c);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x182;
          greatest_info.msg = "28 != expected_count";
        }
LAB_0011844c:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_00118465:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_stops_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/stops.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x19e;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/stops.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_stops((FILE *)pFVar5,&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 6) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_stops_db(&local_58,&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 6) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_stop((stop_t *)(local_60->id + lVar6),(stop_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x1b0;
                greatest_info.msg = "equal_stop(&(expected[i]), &(records[i]))";
                goto LAB_00118713;
              }
              lVar6 = lVar6 + 0x3b0;
            } while (lVar6 != 0x1620);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_0011872c;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",6);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1ae;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",6);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1a3;
          greatest_info.msg = "6 != expected_count";
        }
LAB_00118713:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_0011872c:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_transfers_fetch");
  if (iVar3 != 0) {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      pFVar5 = fopen("../tests/data/stupid_gtfs/transfers.txt","r");
      if (pFVar5 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x1bf;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/transfers.txt` test file";
        iVar3 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
      }
      else {
        uVar4 = read_all_transfers((FILE *)pFVar5,(transfer_t **)&local_60);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 4) {
          init_feed_db(&local_58,"tests_storing.db",1);
          setup_feed_db(&local_58);
          uVar4 = fetch_all_transfers_db(&local_58,(transfer_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar4 == 4) {
            lVar6 = 0;
            do {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar3 = equal_transfer((transfer_t *)(local_60->id + lVar6),
                                     (transfer_t *)(local_68->id + lVar6));
              if (iVar3 == 0) {
                greatest_info.fail_line = 0x1d1;
                greatest_info.msg = "equal_transfer(&(expected[i]), &(records[i]))";
                goto LAB_001189da;
              }
              lVar6 = lVar6 + 0x88;
            } while (lVar6 != 0x220);
            free_feed_db(&local_58);
            free(local_68);
            free(local_60);
            fclose(pFVar5);
            greatest_info.msg = (char *)0x0;
            iVar3 = 0;
            goto LAB_001189f3;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1cf;
          greatest_info.msg = "expected_count != retrieved_count";
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1c4;
          greatest_info.msg = "4 != expected_count";
        }
LAB_001189da:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
        iVar3 = -1;
      }
    }
LAB_001189f3:
    greatest_test_post(iVar3);
  }
  iVar3 = greatest_test_pre("db_all_trips_fetch");
  if (iVar3 == 0) {
    return;
  }
  iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar3 == 0) {
    pFVar5 = fopen("../tests/data/stupid_gtfs/trips.txt","r");
    if (pFVar5 == (FILE *)0x0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      greatest_info.fail_line = 0x1e0;
      greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/trips.txt` test file";
      iVar3 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118cca;
    }
    else {
      uVar4 = read_all_trips((FILE *)pFVar5,(trip_t **)&local_60);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar4 == 4) {
        init_feed_db(&local_58,"tests_storing.db",1);
        setup_feed_db(&local_58);
        uVar4 = fetch_all_trips_db(&local_58,(trip_t **)&local_68);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar4 == 4) {
          lVar6 = 0;
          do {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar3 = equal_trip((trip_t *)(local_60->id + lVar6),(trip_t *)(local_68->id + lVar6));
            if (iVar3 == 0) {
              greatest_info.fail_line = 0x1f2;
              greatest_info.msg = "equal_trip(&(expected[i]), &(records[i]))";
              goto LAB_00118ca1;
            }
            lVar6 = lVar6 + 0x1cc;
          } while (lVar6 != 0x730);
          free_feed_db(&local_58);
          free(local_68);
          free(local_60);
          fclose(pFVar5);
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00118cb6;
        }
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",4);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x1f0;
        greatest_info.msg = "expected_count != retrieved_count";
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",4);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar4);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x1e5;
        greatest_info.msg = "4 != expected_count";
      }
LAB_00118ca1:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) {
LAB_00118cca:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        abort();
      }
      iVar3 = -1;
    }
  }
LAB_00118cb6:
  greatest_test_post(iVar3);
  return;
}

Assistant:

SUITE(CGTFS_DatabaseFetching) {
    RUN_TEST(db_all_agencies_fetch);
    RUN_TEST(db_all_calendar_dates_fetch);
    RUN_TEST(db_all_calendar_records_fetch);
    RUN_TEST(db_all_fare_attributes_fetch);
    RUN_TEST(db_all_fare_rules_fetch);
    RUN_TEST(db_all_feed_info_fetch);
    RUN_TEST(db_all_frequencies_fetch);
    RUN_TEST(db_all_levels_fetch);
    RUN_TEST(db_all_pathways_fetch);
    RUN_TEST(db_all_routes_fetch);
    RUN_TEST(db_all_shapes_fetch);
    RUN_TEST(db_all_stop_times_fetch);
    RUN_TEST(db_all_stops_fetch);
    RUN_TEST(db_all_transfers_fetch);
    RUN_TEST(db_all_trips_fetch);
}